

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_symlink(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  code *cb;
  uint flags;
  
  flags = 0;
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar4 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = lua_type(L,3);
  if (iVar1 == 5) {
    lua_getfield(L,3,"dir");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    lua_getfield(L,3,"junction");
    iVar2 = lua_toboolean(L,-1);
    flags = (iVar1 != 0) + 2;
    if (iVar2 == 0) {
      flags = (uint)(iVar1 != 0);
    }
    lua_settop(L,-2);
  }
  iVar1 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  iVar1 = plVar5->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_symlink(loop,req,pcVar3,pcVar4,flags,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
      return 1;
    }
    iVar1 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar3 = req->path;
    pcVar4 = uv_err_name((int)req->result);
    pcVar6 = uv_strerror((int)req->result);
    if (pcVar3 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar4,pcVar6);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar4,pcVar6,req->path);
    }
    iVar1 = 3;
    pcVar3 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar3);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar1;
}

Assistant:

static int luv_fs_symlink(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  const char* new_path = luaL_checkstring(L, 2);
  int flags = 0, ref;
  uv_fs_t* req;
  if (lua_type(L, 3) == LUA_TTABLE) {
    lua_getfield(L, 3, "dir");
    if (lua_toboolean(L, -1)) flags |= UV_FS_SYMLINK_DIR;
    lua_pop(L, 1);
    lua_getfield(L, 3, "junction");
    if (lua_toboolean(L, -1)) flags |= UV_FS_SYMLINK_JUNCTION;
    lua_pop(L, 1);
  }
  ref = luv_check_continuation(L, 4);
  req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  FS_CALL(symlink, req, path, new_path, flags);
}